

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper2.cpp
# Opt level: O0

void test_cpp_wrapper_get_populated_multiple_all(planck_unit_test_t *tc)

{
  Dictionary<int,_int> *pDVar1;
  Dictionary<int,_int> *dict;
  planck_unit_test_t *tc_local;
  
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  BppTree<int,_int>::BppTree((BppTree<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4);
  test_cpp_wrapper_get_populated_multiple(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
    operator_delete(pDVar1);
  }
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  SkipList<int,_int>::SkipList((SkipList<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,7);
  test_cpp_wrapper_get_populated_multiple(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
    operator_delete(pDVar1);
  }
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0x1e);
  test_cpp_wrapper_get_populated_multiple(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
    operator_delete(pDVar1);
  }
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  OpenAddressHash<int,_int>::OpenAddressHash
            ((OpenAddressHash<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0x32);
  test_cpp_wrapper_get_populated_multiple(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
    operator_delete(pDVar1);
  }
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  OpenAddressFileHash<int,_int>::OpenAddressFileHash
            ((OpenAddressFileHash<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0x32);
  test_cpp_wrapper_get_populated_multiple(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
    operator_delete(pDVar1);
  }
  pDVar1 = (Dictionary<int,_int> *)operator_new(0x80);
  LinearHash<int,_int>::LinearHash
            ((LinearHash<int,_int> *)pDVar1,0,key_type_numeric_signed,4,4,0x32);
  test_cpp_wrapper_get_populated_multiple(tc,pDVar1);
  if (pDVar1 != (Dictionary<int,_int> *)0x0) {
    Dictionary<int,_int>::~Dictionary(pDVar1);
    operator_delete(pDVar1);
  }
  return;
}

Assistant:

void
test_cpp_wrapper_get_populated_multiple_all(
	planck_unit_test_t *tc
) {
	Dictionary<int, int> *dict;

	dict = new BppTree<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int));
	test_cpp_wrapper_get_populated_multiple(tc, dict);
	delete dict;

	dict = new SkipList<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 7);
	test_cpp_wrapper_get_populated_multiple(tc, dict);
	delete dict;

	dict = new FlatFile<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 30);
	test_cpp_wrapper_get_populated_multiple(tc, dict);
	delete dict;

	dict = new OpenAddressHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	test_cpp_wrapper_get_populated_multiple(tc, dict);
	delete dict;

	dict = new OpenAddressFileHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	test_cpp_wrapper_get_populated_multiple(tc, dict);
	delete dict;

	dict = new LinearHash<int, int>(0, key_type_numeric_signed, sizeof(int), sizeof(int), 50);
	test_cpp_wrapper_get_populated_multiple(tc, dict);
	delete dict;
}